

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

string_view __thiscall
slang::ast::getEnumValueName(ast *this,Compilation *comp,string_view name,int32_t index)

{
  int iVar1;
  byte *__dest;
  byte *__src;
  size_t sVar2;
  long lVar3;
  string_view sVar4;
  
  __src = (byte *)name._M_len;
  if (comp == (Compilation *)0x0) {
    sVar2 = 0;
  }
  else {
    iVar1 = snprintf((char *)0x0,0,"%d");
    lVar3 = (long)iVar1;
    sVar2 = (long)&(comp->super_BumpAllocator).head + lVar3;
    __dest = *(byte **)(*(long *)this + 8);
    if (*(byte **)(this + 8) < __dest + sVar2 + 1) {
      __dest = BumpAllocator::allocateSlow
                         ((BumpAllocator *)this,(long)&(comp->super_BumpAllocator).head + lVar3 + 1,
                          1);
    }
    else {
      *(byte **)(*(long *)this + 8) = __dest + sVar2 + 1;
    }
    memcpy(__dest,__src,(size_t)comp);
    snprintf((char *)(__dest + (long)&comp->super_BumpAllocator),lVar3 + 1,"%d",
             (ulong)(uint)name._M_str);
    __src = __dest;
  }
  sVar4._M_str = (char *)__src;
  sVar4._M_len = sVar2;
  return sVar4;
}

Assistant:

static std::string_view getEnumValueName(Compilation& comp, std::string_view name, int32_t index) {
    if (!name.empty()) {
        SLANG_ASSERT(index >= 0);

        size_t sz = (size_t)snprintf(nullptr, 0, "%d", index);
        char* mem = (char*)comp.allocate(sz + name.size() + 1, 1);
        memcpy(mem, name.data(), name.size());
        snprintf(mem + name.size(), sz + 1, "%d", index);

        name = std::string_view(mem, sz + name.size());
    }
    return name;
}